

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O2

Storyboard * __thiscall
ApprovalTests::Storyboard::addFrame(Storyboard *this,string *title,string *frame)

{
  ostream *poVar1;
  
  if (this->addNewLineBeforeNextFrame_ == true) {
    ::std::operator<<((ostream *)&this->field_0x10,'\n');
    this->addNewLineBeforeNextFrame_ = false;
  }
  poVar1 = ::std::operator<<((ostream *)&this->field_0x10,(string *)title);
  ::std::operator<<(poVar1,":\n");
  poVar1 = ::std::operator<<((ostream *)&this->field_0x10,(string *)frame);
  ::std::operator<<(poVar1,"\n\n");
  this->frameCount_ = this->frameCount_ + 1;
  return this;
}

Assistant:

Storyboard& Storyboard::addFrame(const std::string& title, const std::string& frame)
    {
        if (addNewLineBeforeNextFrame_)
        {
            output_ << '\n';
            addNewLineBeforeNextFrame_ = false;
        }
        output_ << title << ":\n";
        output_ << frame << "\n\n";
        frameCount_ += 1;
        return *this;
    }